

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

char * path_encode(char *path)

{
  uint uVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  ushort *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar2 = (ushort *)strlen(path);
  uVar9 = 0;
  uVar8 = (ulong)puVar2 & 0xffffffff;
  if ((int)puVar2 < 1) {
    uVar8 = uVar9;
  }
  puVar7 = (ushort *)0x0;
  for (; uVar6 = (uint)puVar7, uVar8 != uVar9; uVar9 = uVar9 + 1) {
    bVar5 = path[uVar9];
    if ((bVar5 - 0x2e < 0x32) && ((0x2000000000003U >> ((ulong)(bVar5 - 0x2e) & 0x3f) & 1) != 0)) {
LAB_0018e2ef:
      iVar4 = 1;
      puVar2 = puVar7;
      uVar1 = uVar6;
      if (0xffe < uVar6) break;
    }
    else {
      ppuVar3 = __ctype_b_loc();
      puVar2 = *ppuVar3;
      if ((puVar2[(char)bVar5] & 8) != 0) goto LAB_0018e2ef;
      if (0xffc < uVar6) break;
      *(undefined1 *)(puVar7 + 0xfb1f8) = 0x2d;
      uVar1 = uVar6 + 2;
      *(char *)((long)puVar7 + 0x1f63f1) = "0123456789ABCDEF"[bVar5 >> 4];
      bVar5 = "0123456789ABCDEF"[bVar5 & 0xf];
      iVar4 = 3;
    }
    puVar7 = (ushort *)(ulong)(uVar6 + iVar4);
    puVar2 = (ushort *)(ulong)uVar1;
    *(byte *)(puVar2 + 0xfb1f8) = bVar5;
  }
  *(undefined1 *)(puVar7 + 0xfb1f8) = 0;
  return (char *)puVar2;
}

Assistant:

static const char *path_encode(const char *path)
{
	static char temp[FILENAME_MAX];
	int i, pos = 0;
	int path_len = (int)strlen(path);
	for (i = 0; i < path_len; ++i) {
		int ch = path[i];
		if (valid_path_char(ch)) {
			if (pos >= sizeof(temp) - 1)
				break;

			temp[pos++] = (char)ch;
		} else {
			if (pos >= sizeof(temp) - 3)
				break;

			temp[pos++] = '-';
			temp[pos++] = "0123456789ABCDEF"[(ch >> 4) & 0xF];
			temp[pos++] = "0123456789ABCDEF"[ch & 0xF];
		}
	}

	temp[pos] = '\0';
	return temp;
}